

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O1

void linenoiseAddCompletion(linenoiseCompletions *lc,char *str)

{
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  char **ppcVar3;
  
  sVar2 = strlen(str);
  __dest = (char *)malloc(sVar2 + 1);
  if (__dest != (char *)0x0) {
    memcpy(__dest,str,sVar2 + 1);
    ppcVar3 = (char **)realloc(lc->cvec,lc->len * 8 + 8);
    if (ppcVar3 == (char **)0x0) {
      free(__dest);
      return;
    }
    lc->cvec = ppcVar3;
    sVar1 = lc->len;
    lc->len = sVar1 + 1;
    ppcVar3[sVar1] = __dest;
  }
  return;
}

Assistant:

void linenoiseAddCompletion(linenoiseCompletions *lc, const char *str) {
    size_t len = strlen(str);
    char *copy, **cvec;

    copy = malloc(len+1);
    if (copy == NULL) return;
    memcpy(copy,str,len+1);
    cvec = realloc(lc->cvec,sizeof(char*)*(lc->len+1));
    if (cvec == NULL) {
        free(copy);
        return;
    }
    lc->cvec = cvec;
    lc->cvec[lc->len++] = copy;
}